

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O1

Fxu_Matrix * Fxu_MatrixAllocate(void)

{
  uint uVar1;
  uint uVar2;
  Fxu_Matrix *__s;
  Fxu_ListDouble *__s_00;
  Extra_MmFixed_t *pEVar3;
  Fxu_HeapDouble *pFVar4;
  Fxu_HeapSingle *pFVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  uint uVar8;
  int iVar9;
  
  __s = (Fxu_Matrix *)malloc(0xd0);
  memset(__s,0,0xd0);
  uVar8 = 9999;
  while( true ) {
    do {
      uVar1 = uVar8 + 1;
      uVar2 = uVar8 & 1;
      uVar8 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar9 = 5;
    while (uVar1 % (iVar9 - 2U) != 0) {
      uVar2 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar1 < uVar2) goto LAB_004b3861;
    }
  }
LAB_004b3861:
  __s->nTableSize = uVar1;
  __s_00 = (Fxu_ListDouble *)malloc((long)(int)uVar1 * 0x18);
  __s->pTable = __s_00;
  memset(__s_00,0,(long)(int)uVar1 * 0x18);
  pEVar3 = Extra_MmFixedStart(0x48);
  __s->pMemMan = pEVar3;
  pFVar4 = Fxu_HeapDoubleStart();
  __s->pHeapDouble = pFVar4;
  pFVar5 = Fxu_HeapSingleStart();
  __s->pHeapSingle = pFVar5;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  __s->vPairs = pVVar6;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fxu_Matrix * Fxu_MatrixAllocate()
{
    Fxu_Matrix * p;
    p = ABC_ALLOC( Fxu_Matrix, 1 );
    memset( p, 0, sizeof(Fxu_Matrix) );
    p->nTableSize = Abc_PrimeCudd(10000);
    p->pTable = ABC_ALLOC( Fxu_ListDouble, p->nTableSize );
    memset( p->pTable, 0, sizeof(Fxu_ListDouble) * p->nTableSize );
#ifndef USE_SYSTEM_MEMORY_MANAGEMENT
    {
        // get the largest size in bytes for the following structures:
        // Fxu_Cube, Fxu_Var, Fxu_Lit, Fxu_Pair, Fxu_Double, Fxu_Single
        // (currently, Fxu_Var, Fxu_Pair, Fxu_Double take 10 machine words)
        int nSizeMax, nSizeCur;
        nSizeMax = -1;
        nSizeCur = sizeof(Fxu_Cube);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Var);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Lit);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Pair);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Double);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Single);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        p->pMemMan  = Extra_MmFixedStart( nSizeMax ); 
    }
#endif
    p->pHeapDouble = Fxu_HeapDoubleStart();
    p->pHeapSingle = Fxu_HeapSingleStart();
    p->vPairs = Vec_PtrAlloc( 100 );
    return p;
}